

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String Bstrlib::operator+(char c,String *b)

{
  uchar *extraout_RDX;
  undefined7 in_register_00000039;
  String SVar2;
  String SStack_28;
  uchar *puVar1;
  
  String::String(&SStack_28,(char)b);
  SVar2 = String::operator+((String *)CONCAT71(in_register_00000039,c),&SStack_28);
  puVar1 = SVar2.super_tagbstring.data;
  if (SStack_28.super_tagbstring.data != (uchar *)0x0) {
    free(SStack_28.super_tagbstring.data);
    puVar1 = extraout_RDX;
  }
  SVar2.super_tagbstring.data = puVar1;
  SVar2.super_tagbstring._0_8_ = (String *)CONCAT71(in_register_00000039,c);
  return (String)SVar2.super_tagbstring;
}

Assistant:

const String operator+(char c, const String& b)
    {
        return String(c) + b;
    }